

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

int Saig_BmcPerform(Aig_Man_t *pAig,int nStart,int nFramesMax,int nNodesMax,int nTimeOut,
                   int nConfMaxOne,int nConfMaxAll,int fVerbose,int fVerbOverwrite,int *piFrames,
                   int fSilent,int fUseSatoko)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  abctime aVar10;
  Aig_Man_t *p_00;
  abctime aVar11;
  int local_d0;
  int local_c8;
  int local_a4;
  abctime local_88;
  int local_7c;
  int Status;
  abctime clkTotal;
  abctime clk2;
  abctime clk;
  abctime nTimeToStop;
  uint local_50;
  int RetValue;
  int Iter;
  int nOutsSolved;
  Cnf_Dat_t *pCnf;
  Aig_Man_t *pNew;
  Saig_Bmc_t *p;
  uint local_28;
  int nConfMaxOne_local;
  int nTimeOut_local;
  int nNodesMax_local;
  int nFramesMax_local;
  int nStart_local;
  Aig_Man_t *pAig_local;
  
  RetValue = 0;
  nTimeToStop._4_4_ = -1;
  p._4_4_ = nConfMaxOne;
  local_28 = nTimeOut;
  nConfMaxOne_local = nNodesMax;
  nTimeOut_local = nFramesMax;
  nNodesMax_local = nStart;
  _nFramesMax_local = pAig;
  if (nTimeOut == 0) {
    local_88 = 0;
  }
  else {
    aVar9 = Abc_Clock();
    local_88 = (long)nTimeOut * 1000000 + aVar9;
  }
  aVar9 = Abc_Clock();
  aVar10 = Abc_Clock();
  local_7c = -1;
  if (fVerbose != 0) {
    uVar2 = Saig_ManPiNum(_nFramesMax_local);
    uVar3 = Saig_ManPoNum(_nFramesMax_local);
    uVar4 = Saig_ManRegNum(_nFramesMax_local);
    uVar5 = Aig_ManNodeNum(_nFramesMax_local);
    uVar6 = Aig_ManLevelNum(_nFramesMax_local);
    printf("Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar2,
           (ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    printf("Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n",
           (ulong)(uint)nTimeOut_local,(ulong)(uint)nConfMaxOne_local,(ulong)p._4_4_,
           (ulong)(uint)nConfMaxAll);
  }
  if (nTimeOut_local == 0) {
    local_a4 = 1000000000;
  }
  else {
    local_a4 = nTimeOut_local;
  }
  nTimeOut_local = local_a4;
  pNew = (Aig_Man_t *)
         Saig_BmcManStart(_nFramesMax_local,local_a4,nConfMaxOne_local,p._4_4_,nConfMaxAll,fVerbose,
                          fUseSatoko);
  if (local_28 != 0) {
    if ((satoko_t *)(pNew->Ghost).pFanin1 == (satoko_t *)0x0) {
      sat_solver_set_runtime_limit((sat_solver *)(pNew->Ghost).pFanin0,local_88);
    }
    else {
      satoko_set_runtime_limit((satoko_t *)(pNew->Ghost).pFanin1,local_88);
    }
  }
  local_50 = 0;
  while( true ) {
    Abc_Clock();
    Saig_BmcInterval((Saig_Bmc_t *)pNew);
    iVar7 = Vec_PtrSize(*(Vec_Ptr_t **)&pNew->nRegs);
    if (iVar7 == 0) break;
    p_00 = Saig_BmcIntervalToAig((Saig_Bmc_t *)pNew);
    pCnf = (Cnf_Dat_t *)p_00;
    iVar7 = Aig_ManCoNum(p_00);
    _Iter = Cnf_Derive(p_00,iVar7);
    Cnf_DataLift(_Iter,*(int *)&(pNew->Ghost).field_0x18);
    *(int *)&(pNew->Ghost).field_0x18 = _Iter->nVars + *(int *)&(pNew->Ghost).field_0x18;
    Saig_BmcLoadCnf((Saig_Bmc_t *)pNew,_Iter);
    Cnf_DataFree(_Iter);
    Aig_ManStop((Aig_Man_t *)pCnf);
    nTimeToStop._4_4_ = Saig_BmcSolveTargets((Saig_Bmc_t *)pNew,nNodesMax_local,&RetValue);
    if (fVerbose != 0) {
      uVar2 = pNew->nAsserts;
      uVar3 = pNew->nConstrs;
      uVar5 = Aig_ManNodeNum((Aig_Man_t *)pNew->vObjs);
      uVar4 = *(uint *)&(pNew->Ghost).field_0x18;
      if ((pNew->Ghost).pFanin0 == (Aig_Obj_t *)0x0) {
        local_c8 = satoko_conflictnum((satoko_t *)(pNew->Ghost).pFanin1);
      }
      else {
        local_c8 = (int)(pNew->Ghost).pFanin0[9].pFanin0;
      }
      printf("%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ",(ulong)local_50,(ulong)uVar2,
             (ulong)uVar3,(ulong)uVar5,(ulong)uVar4,local_c8);
      printf("%4.0f MB",
             ((double)(pNew->nAsserts + 1) * 4.0 * (double)*(int *)&pNew->pConst1) / 1048576.0);
      aVar11 = Abc_Clock();
      printf("%9.2f sec",(double)((float)(aVar11 - aVar10) / 1e+06));
      printf("\n");
      fflush(_stdout);
    }
    if (nTimeToStop._4_4_ != -1) break;
    if ((local_28 != 0) && (aVar11 = Abc_Clock(), local_88 < aVar11)) {
      if (fSilent == 0) {
        printf("Reached timeout (%d seconds).\n",(ulong)local_28);
      }
      if (piFrames != (int *)0x0) {
        *piFrames = pNew->nAsserts + -1;
      }
      Saig_BmcManStop((Saig_Bmc_t *)pNew);
      return -1;
    }
    local_50 = local_50 + 1;
  }
  if (nTimeToStop._4_4_ == 1) {
    iVar7 = pNew->nBarBufs;
    iVar8 = Saig_ManPoNum((Aig_Man_t *)pNew->vCos);
    if (iVar7 * iVar8 + pNew->nObjs[0] + 1 != RetValue) {
      __assert_fail("p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                    ,0x37a,
                    "int Saig_BmcPerform(Aig_Man_t *, int, int, int, int, int, int, int, int, int *, int, int)"
                   );
    }
    if (fSilent == 0) {
      uVar1._0_4_ = pNew->vCos->nCap;
      uVar1._4_4_ = pNew->vCos->nSize;
      Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d. ",(ulong)(uint)pNew->nObjs[0]
                ,uVar1,(ulong)(uint)pNew->nBarBufs);
    }
    local_7c = 0;
    if (piFrames != (int *)0x0) {
      *piFrames = pNew->nBarBufs + -1;
    }
  }
  else {
    if (fSilent == 0) {
      uVar2 = Abc_MaxInt(pNew->nTruePos + -1,0);
      Abc_Print(1,"No output failed in %d frames.  ",(ulong)uVar2);
    }
    if (piFrames != (int *)0x0) {
      if (pNew->nConstrs < 1) {
        *piFrames = pNew->nTruePos + -1;
      }
      else {
        *piFrames = pNew->nTruePos + -2;
      }
    }
  }
  if (fSilent == 0) {
    if (fVerbOverwrite == 0) {
      Abc_Print(1,"%s =","Time");
      aVar10 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - aVar9) * 1.0) / 1000000.0);
    }
    else {
      Abc_Print(1,"%s =","Time");
      aVar10 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\r",((double)(aVar10 - aVar9) * 1.0) / 1000000.0);
    }
    if (nTimeToStop._4_4_ != 1) {
      if (pNew->nAsserts < *(int *)&pNew->pName) {
        if (*(int *)((long)&pNew->pSpec + 4) != 0) {
          if ((pNew->Ghost).pFanin0 == (Aig_Obj_t *)0x0) {
            local_d0 = satoko_conflictnum((satoko_t *)(pNew->Ghost).pFanin1);
          }
          else {
            local_d0 = (int)(pNew->Ghost).pFanin0[9].pFanin0;
          }
          if (*(int *)((long)&pNew->pSpec + 4) < local_d0) {
            printf("Reached global conflict limit (%d).\n",(ulong)*(uint *)((long)&pNew->pSpec + 4))
            ;
            goto LAB_006aee0f;
          }
        }
        if ((local_28 == 0) || (aVar9 = Abc_Clock(), aVar9 <= local_88)) {
          printf("Reached local conflict limit (%d).\n",(ulong)*(uint *)&pNew->pSpec);
        }
        else {
          printf("Reached timeout (%d seconds).\n",(ulong)local_28);
        }
      }
      else {
        printf("Reached limit on the number of timeframes (%d).\n",(ulong)*(uint *)&pNew->pName);
      }
    }
  }
LAB_006aee0f:
  Saig_BmcManStop((Saig_Bmc_t *)pNew);
  fflush(_stdout);
  return local_7c;
}

Assistant:

int Saig_BmcPerform( Aig_Man_t * pAig, int nStart, int nFramesMax, int nNodesMax, int nTimeOut, int nConfMaxOne, int nConfMaxAll, int fVerbose, int fVerbOverwrite, int * piFrames, int fSilent, int fUseSatoko )
{
    Saig_Bmc_t * p;
    Aig_Man_t * pNew;
    Cnf_Dat_t * pCnf;
    int nOutsSolved = 0;
    int Iter, RetValue = -1;
    abctime nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime clk = Abc_Clock(), clk2, clkTotal = Abc_Clock();
    int Status = -1;
/*
    Vec_Ptr_t * vSimInfo;
    vSimInfo = Abs_ManTernarySimulate( pAig, nFramesMax, fVerbose );
    Abs_ManFreeAray( vSimInfo );
*/
    if ( fVerbose )
    {
        printf( "Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n", 
            nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll );
    } 
    nFramesMax = nFramesMax ? nFramesMax : ABC_INFINITY;
    p = Saig_BmcManStart( pAig, nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll, fVerbose, fUseSatoko );
    // set runtime limit
    if ( nTimeOut )
    {
        if ( p->pSat2 )
            satoko_set_runtime_limit( p->pSat2, nTimeToStop );
        else
            sat_solver_set_runtime_limit( p->pSat, nTimeToStop );
    }
    for ( Iter = 0; ; Iter++ )
    {
        clk2 = Abc_Clock();
        // add new logic interval to frames
        Saig_BmcInterval( p );
//        Saig_BmcAddTargetsAsPos( p );
        if ( Vec_PtrSize(p->vTargets) == 0 )
            break;
        // convert logic slice into new AIG
        pNew = Saig_BmcIntervalToAig( p );
//printf( "StitchVars = %d.\n", p->nStitchVars );
        // derive CNF for the new AIG
        pCnf = Cnf_Derive( pNew, Aig_ManCoNum(pNew) );
        Cnf_DataLift( pCnf, p->nSatVars );
        p->nSatVars += pCnf->nVars;
        // add this CNF to the solver
        Saig_BmcLoadCnf( p, pCnf );
        Cnf_DataFree( pCnf );
        Aig_ManStop( pNew );
        // solve the targets
        RetValue = Saig_BmcSolveTargets( p, nStart, &nOutsSolved );
        if ( fVerbose )
        {
            printf( "%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ", 
                Iter, p->iFrameLast, p->iOutputLast, Aig_ManNodeNum(p->pFrm), p->nSatVars, 
                p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2) );   
            printf( "%4.0f MB",     4.0*(p->iFrameLast+1)*p->nObjs/(1<<20) );
            printf( "%9.2f sec", (float)(Abc_Clock() - clkTotal)/(float)(CLOCKS_PER_SEC) );
            printf( "\n" );
            fflush( stdout );
        }
        if ( RetValue != l_False )
            break;
        // check the timeout
        if ( nTimeOut && Abc_Clock() > nTimeToStop )
        {
            if ( !fSilent )
                printf( "Reached timeout (%d seconds).\n",  nTimeOut );
            if ( piFrames )
                *piFrames = p->iFrameLast-1;
            Saig_BmcManStop( p );
            return Status;
        }
    }
    if ( RetValue == l_True )
    {
        assert( p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved );
        if ( !fSilent )
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", 
                p->iOutputFail, p->pAig->pName, p->iFrameFail );
        Status = 0;
        if ( piFrames )
            *piFrames = p->iFrameFail - 1;
    }
    else // if ( RetValue == l_False || RetValue == l_Undef )
    {
        if ( !fSilent )
            Abc_Print( 1, "No output failed in %d frames.  ", Abc_MaxInt(p->iFramePrev-1, 0) );
        if ( piFrames )
        {
            if ( p->iOutputLast > 0 )
                *piFrames = p->iFramePrev - 2;
            else
                *piFrames = p->iFramePrev - 1;
        }
    }
    if ( !fSilent )
    {
        if ( fVerbOverwrite )
        {
            ABC_PRTr( "Time", Abc_Clock() - clk );
        }
        else
        {
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( RetValue != l_True )
        {
            if ( p->iFrameLast >= p->nFramesMax )
                printf( "Reached limit on the number of timeframes (%d).\n", p->nFramesMax );
            else if ( p->nConfMaxAll && (p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2)) > p->nConfMaxAll )
                printf( "Reached global conflict limit (%d).\n", p->nConfMaxAll );
            else if ( nTimeOut && Abc_Clock() > nTimeToStop )
                printf( "Reached timeout (%d seconds).\n", nTimeOut );
            else
                printf( "Reached local conflict limit (%d).\n", p->nConfMaxOne );
        }
    }
    Saig_BmcManStop( p );
    fflush( stdout );
    return Status;
}